

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

wchar_t archive_read_format_cab_read_data_skip(archive_read *a)

{
  void *pvVar1;
  wchar_t wVar2;
  int64_t iVar3;
  
  pvVar1 = a->format->data;
  if (*(char *)((long)pvVar1 + 0x91) != '\0') {
    return L'\x01';
  }
  if (*(char *)((long)pvVar1 + 0x94) == '\0') {
    *(long *)((long)pvVar1 + 0x98) = *(long *)((long)pvVar1 + 0x98) + *(long *)((long)pvVar1 + 8);
    *(undefined8 *)((long)pvVar1 + 8) = 0;
    goto LAB_00121f6d;
  }
  if (*(long *)((long)pvVar1 + 0x10) == 0) {
    if (*(long *)((long)pvVar1 + 0x38) == 0) {
      wVar2 = cab_next_cfdata(a);
      goto LAB_00121f54;
    }
  }
  else {
    iVar3 = cab_consume_cfdata(a,*(long *)((long)pvVar1 + 0x10));
    wVar2 = (wchar_t)iVar3;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
LAB_00121f54:
    if (wVar2 < L'\0') {
      return wVar2;
    }
  }
  if (*(char *)((long)pvVar1 + 0x93) != '\0') {
    return L'\0';
  }
  iVar3 = cab_consume_cfdata(a,*(int64_t *)((long)pvVar1 + 8));
  if (iVar3 < 0) {
    return L'\xffffffe2';
  }
  if ((*(short *)(*(long *)((long)pvVar1 + 0x28) + 6) == 0) && (*(long *)((long)pvVar1 + 0x38) != 0)
     ) {
    *(undefined8 *)(*(long *)((long)pvVar1 + 0x38) + 0x10) = 0;
  }
LAB_00121f6d:
  *(undefined1 *)((long)pvVar1 + 0x92) = 1;
  *(undefined1 *)((long)pvVar1 + 0x93) = 1;
  return L'\0';
}

Assistant:

static int
archive_read_format_cab_read_data_skip(struct archive_read *a)
{
	struct cab *cab;
	int64_t bytes_skipped;
	int r;

	cab = (struct cab *)(a->format->data);

	if (cab->end_of_archive)
		return (ARCHIVE_EOF);

	if (!cab->read_data_invoked) {
		cab->bytes_skipped += cab->entry_bytes_remaining;
		cab->entry_bytes_remaining = 0;
		/* This entry is finished and done. */
		cab->end_of_entry_cleanup = cab->end_of_entry = 1;
		return (ARCHIVE_OK);
	}

	if (cab->entry_unconsumed) {
		/* Consume as much as the compressor actually used. */
		r = (int)cab_consume_cfdata(a, cab->entry_unconsumed);
		cab->entry_unconsumed = 0;
		if (r < 0)
			return (r);
	} else if (cab->entry_cfdata == NULL) {
		r = cab_next_cfdata(a);
		if (r < 0)
			return (r);
	}

	/* if we've already read to end of data, we're done. */
	if (cab->end_of_entry_cleanup)
		return (ARCHIVE_OK);

	/*
	 * If the length is at the beginning, we can skip the
	 * compressed data much more quickly.
	 */
	bytes_skipped = cab_consume_cfdata(a, cab->entry_bytes_remaining);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If the compression type is none(uncompressed), we've already
	 * consumed data as much as the current entry size. */
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE &&
	    cab->entry_cfdata != NULL)
		cab->entry_cfdata->unconsumed = 0;

	/* This entry is finished and done. */
	cab->end_of_entry_cleanup = cab->end_of_entry = 1;
	return (ARCHIVE_OK);
}